

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O0

Pixmap __thiscall
Am_Image_Array_Data::Make_Pixmap_From_Generic_Image
          (Am_Image_Array_Data *this,Am_Drawonable_Impl *draw,XColor **cols,int *n_cols)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  XColor *pXVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  int iVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  uchar *puVar14;
  undefined4 *puVar15;
  Pixmap PVar16;
  long lVar17;
  Pixmap pix;
  XImage *image;
  uint32_t *x_image_32;
  unsigned_short *x_image_16;
  int local_60;
  int j;
  int i_1;
  int byte_width;
  uchar *x_image;
  Visual *visual;
  int depth;
  uchar *gif_image;
  unsigned_short height;
  unsigned_short width;
  int i;
  Am_RGB_Value *ctbl;
  int *n_cols_local;
  XColor **cols_local;
  Am_Drawonable_Impl *draw_local;
  Am_Image_Array_Data *this_local;
  
  ctbl = (Am_RGB_Value *)n_cols;
  n_cols_local = (int *)cols;
  cols_local = (XColor **)draw;
  draw_local = (Am_Drawonable_Impl *)this;
  iVar10 = Am_Generic_Image::Get_Color_Map(this->image_,(Am_RGB_Value **)&height);
  ctbl->red = (short)iVar10;
  ctbl->green = (short)((uint)iVar10 >> 0x10);
  iVar10._0_2_ = ctbl->red;
  iVar10._2_2_ = ctbl->green;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (long)iVar10;
  uVar12 = SUB168(auVar9 * ZEXT816(0x10),0);
  if (SUB168(auVar9 * ZEXT816(0x10),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar12);
  *(void **)n_cols_local = pvVar13;
  for (gif_image._4_4_ = 0; iVar1._0_2_ = ctbl->red, iVar1._2_2_ = ctbl->green,
      gif_image._4_4_ < iVar1; gif_image._4_4_ = gif_image._4_4_ + 1) {
    *(unsigned_short *)(*(long *)n_cols_local + (long)gif_image._4_4_ * 0x10 + 8) =
         _height[gif_image._4_4_].red << 8;
    *(unsigned_short *)(*(long *)n_cols_local + (long)gif_image._4_4_ * 0x10 + 10) =
         _height[gif_image._4_4_].green << 8;
    *(unsigned_short *)(*(long *)n_cols_local + (long)gif_image._4_4_ * 0x10 + 0xc) =
         _height[gif_image._4_4_].blue << 8;
    Am_Drawonable_Impl::Allocate_Closest_Color
              ((Am_Drawonable_Impl *)cols_local,
               (XColor *)(*(long *)n_cols_local + (long)gif_image._4_4_ * 0x10));
  }
  Am_Generic_Image::Get_Size
            (this->image_,(unsigned_short *)((long)&gif_image + 2),(unsigned_short *)&gif_image);
  puVar14 = Am_Generic_Image::Get_Data(this->image_);
  iVar2._0_2_ = cols_local[0xe][3].red;
  iVar2._2_2_ = cols_local[0xe][3].green;
  uVar3 = *(undefined8 *)
           (*(long *)(*(long *)&cols_local[0xe]->red + 0xe8) +
            (long)(int)cols_local[0xe][2].pixel * 0x80 + 0x40);
  if (iVar2 == 1) {
    uVar11 = (gif_image._2_2_ + 7) / 8;
    _i_1 = malloc((long)(int)(uVar11 * (ushort)gif_image));
    for (local_60 = 0; local_60 < (int)(uint)(ushort)gif_image; local_60 = local_60 + 1) {
      for (x_image_16._4_4_ = 0; x_image_16._4_4_ < (int)(uint)gif_image._2_2_;
          x_image_16._4_4_ = x_image_16._4_4_ + 1) {
        if (*(long *)(*(long *)n_cols_local +
                     (ulong)puVar14[(int)(local_60 * (uint)gif_image._2_2_ + x_image_16._4_4_)] *
                     0x10) == 0) {
          lVar17 = (long)(int)(local_60 * uVar11 + x_image_16._4_4_ / 8);
          *(byte *)((long)_i_1 + lVar17) =
               *(byte *)((long)_i_1 + lVar17) &
               (Make_Pixmap_From_Generic_Image::byte_array[x_image_16._4_4_ % 8] ^ 0xff);
        }
        else {
          lVar17 = (long)(int)(local_60 * uVar11 + x_image_16._4_4_ / 8);
          *(byte *)((long)_i_1 + lVar17) =
               *(byte *)((long)_i_1 + lVar17) |
               Make_Pixmap_From_Generic_Image::byte_array[x_image_16._4_4_ % 8];
        }
      }
    }
  }
  else if (iVar2 < 9) {
    _i_1 = malloc((long)(int)((uint)gif_image._2_2_ * (uint)(ushort)gif_image));
    for (gif_image._4_4_ = 0;
        gif_image._4_4_ < (int)((uint)gif_image._2_2_ * (uint)(ushort)gif_image);
        gif_image._4_4_ = gif_image._4_4_ + 1) {
      *(char *)((long)_i_1 + (long)gif_image._4_4_) =
           (char)*(undefined8 *)(*(long *)n_cols_local + (ulong)puVar14[gif_image._4_4_] * 0x10);
    }
  }
  else if (iVar2 < 0x11) {
    _i_1 = malloc((long)(int)((uint)gif_image._2_2_ * (uint)(ushort)gif_image * 2));
    for (gif_image._4_4_ = 0;
        gif_image._4_4_ < (int)((uint)gif_image._2_2_ * (uint)(ushort)gif_image);
        gif_image._4_4_ = gif_image._4_4_ + 1) {
      *(short *)((long)_i_1 + (long)gif_image._4_4_ * 2) =
           (short)*(undefined8 *)(*(long *)n_cols_local + (ulong)puVar14[gif_image._4_4_] * 0x10);
    }
  }
  else {
    _i_1 = malloc((long)(int)((uint)gif_image._2_2_ * (uint)(ushort)gif_image * 4));
    for (gif_image._4_4_ = 0;
        gif_image._4_4_ < (int)((uint)gif_image._2_2_ * (uint)(ushort)gif_image);
        gif_image._4_4_ = gif_image._4_4_ + 1) {
      *(int *)((long)_i_1 + (long)gif_image._4_4_ * 4) =
           (int)*(undefined8 *)(*(long *)n_cols_local + (ulong)puVar14[gif_image._4_4_] * 0x10);
    }
  }
  pXVar4 = cols_local[0xe];
  uVar5._0_2_ = pXVar4->red;
  uVar5._2_2_ = pXVar4->green;
  uVar5._4_2_ = pXVar4->blue;
  uVar5._6_1_ = pXVar4->flags;
  uVar5._7_1_ = pXVar4->pad;
  puVar15 = (undefined4 *)
            XCreateImage(uVar5,uVar3,iVar2,2,0,_i_1,gif_image._2_2_,(ushort)gif_image,8,0);
  pXVar4 = cols_local[0xe];
  uVar3._0_2_ = pXVar4->red;
  uVar3._2_2_ = pXVar4->green;
  uVar3._4_2_ = pXVar4->blue;
  uVar3._6_1_ = pXVar4->flags;
  uVar3._7_1_ = pXVar4->pad;
  PVar16 = XCreatePixmap(uVar3,cols_local[0x10],*puVar15,puVar15[1],puVar15[10]);
  Am_Drawonable_Impl::set_gc_using_fill
            ((Am_Drawonable_Impl *)cols_local,&Am_No_Style,Am_DRAW_COPY,0);
  pXVar4 = cols_local[0xe];
  uVar6._0_2_ = pXVar4->red;
  uVar6._2_2_ = pXVar4->green;
  uVar6._4_2_ = pXVar4->blue;
  uVar6._6_1_ = pXVar4->flags;
  uVar6._7_1_ = pXVar4->pad;
  XSetClipMask(uVar6,cols_local[0xe][5].pixel,0);
  pXVar4 = cols_local[0xe];
  uVar7._0_2_ = pXVar4->red;
  uVar7._2_2_ = pXVar4->green;
  uVar7._4_2_ = pXVar4->blue;
  uVar7._6_1_ = pXVar4->flags;
  uVar7._7_1_ = pXVar4->pad;
  XPutImage(uVar7,PVar16,cols_local[0xe][5].pixel,puVar15,0,0,0,0,*puVar15,puVar15[1]);
  pXVar4 = cols_local[0xe];
  uVar8._0_2_ = pXVar4[5].red;
  uVar8._2_2_ = pXVar4[5].green;
  uVar8._4_2_ = pXVar4[5].blue;
  uVar8._6_1_ = pXVar4[5].flags;
  uVar8._7_1_ = pXVar4[5].pad;
  (*(code *)(*cols_local)[0xf].pixel)(cols_local,uVar8);
  (**(code **)(puVar15 + 0x18))(puVar15);
  return PVar16;
}

Assistant:

Pixmap
Am_Image_Array_Data::Make_Pixmap_From_Generic_Image(
    const Am_Drawonable_Impl *draw, XColor *&cols, int &n_cols)
{
  // Make a copy of the image data, and adjust colors in the image
  // to the ones we have in the X colormap.
  Am_RGB_Value *ctbl;
  n_cols = image_->Get_Color_Map(ctbl);
  cols = new XColor[n_cols];

  int i;
  // first, allocate all the closest colors.  Could be optimized a lot!
  for (i = 0; i < n_cols; i++) {
    cols[i].red = ctbl[i].red * 256;
    cols[i].green = ctbl[i].green * 256;
    cols[i].blue = ctbl[i].blue * 256;
    draw->Allocate_Closest_Color(cols[i]);
  }

  // Next, set the pixels in the image correctly.
  unsigned short width, height;
  image_->Get_Size(width, height);
  unsigned char *gif_image = image_->Get_Data();

  int depth = draw->screen->depth;
  Visual *visual =
      DefaultVisual(draw->screen->display, draw->screen->screen_number);

  unsigned char *x_image;

  // assume that pixels are packed into even byte boundaries
  if (depth == 1) {
    static unsigned char byte_array[] = {0x80, 0x40, 0x20, 0x10,
                                         0x08, 0x04, 0x02, 0x01};
    // X uses free() so we must use malloc.  (so says sentinel)
    int byte_width = (width + 7) / 8;
    x_image = (unsigned char *)malloc(byte_width * height);
    int i, j;
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        if (cols[gif_image[i * width + j]].pixel)
          x_image[i * byte_width + (j / 8)] |= byte_array[j % 8];
        else
          x_image[i * byte_width + (j / 8)] &= ~byte_array[j % 8];
      }
    }
  } else if (depth <= 8) {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height);
    for (i = 0; i < (width * height); i++)
      x_image[i] = (unsigned char)(cols[gif_image[i]].pixel);
  } else if (depth <= 16) {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height * 2);
    unsigned short *x_image_16 = (unsigned short *)x_image;
    for (i = 0; i < (width * height); i++)
      x_image_16[i] = (unsigned short)(cols[gif_image[i]].pixel);
  } else {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height * 4);
    uint32_t *x_image_32 = (uint32_t*)x_image;
    for (i = 0; i < (width * height); i++)
      x_image_32[i] = (uint32_t)(cols[gif_image[i]].pixel);
  }

  XImage *image = XCreateImage(draw->screen->display, visual, depth, ZPixmap,
                               0 /* offset */, (char *)x_image, width, height,
                               8 /* bitmap_pad */,
                               0 /* (X will calculate) bytes per line */);

  Pixmap pix = XCreatePixmap(draw->screen->display, draw->xlib_drawable,
                             image->width, image->height, image->depth);
  draw->set_gc_using_fill(Am_No_Style, Am_DRAW_COPY);
  // Clear the clip region; restore it later.
  XSetClipMask(draw->screen->display, draw->screen->gc, None);
  XPutImage(draw->screen->display, pix, draw->screen->gc, image, 0, 0, 0, 0,
            image->width, image->height);
  ((Am_Drawonable_Impl *)draw)->Set_Clip(draw->screen->clip_region);

  XDestroyImage(image);

  return pix;
}